

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-tree.c
# Opt level: O1

nametree_entry_t *
ndn_nametree_prefix_match
          (ndn_nametree_t *nametree,uint8_t *name,size_t len,NDN_NAMETREE_ENTRY_TYPE type)

{
  int iVar1;
  ulong uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  size_t __n;
  ulong uVar7;
  bool bVar8;
  
  if (1 < len) {
    uVar6 = (ulong)(0xfc < name[1]) * 2 + 2;
    uVar5 = 0xffff;
    if (uVar6 < len) {
      uVar2 = 0;
      do {
        uVar7 = (ulong)name[uVar6 + 1] + 2;
        __n = 0x24;
        if (uVar7 < 0x24) {
          __n = uVar7;
        }
        uVar3 = *(ushort *)(nametree + uVar2 * 0x2e + 0x26);
        if (uVar3 == 0xffff) {
          bVar8 = false;
        }
        else {
          do {
            iVar1 = memcmp(name + uVar6,nametree + (ulong)uVar3 * 0x2e,__n);
            if (iVar1 < 1) goto LAB_00114c19;
            uVar3 = *(ushort *)(nametree + (ulong)uVar3 * 0x2e + 0x28);
          } while (uVar3 != 0xffff);
          iVar1 = 1;
LAB_00114c19:
          bVar8 = iVar1 == 0;
        }
        if (!bVar8) break;
        uVar2 = (ulong)uVar3;
        uVar4 = uVar5;
        if (*(short *)(nametree + uVar2 * 0x2e + 0x2c) != -1) {
          uVar4 = (uint)uVar3;
        }
        if (type != NDN_NAMETREE_FIB_TYPE) {
          uVar4 = uVar5;
        }
        uVar5 = uVar4;
        if (*(short *)(nametree + uVar2 * 0x2e + 0x2a) != -1) {
          uVar5 = (uint)uVar3;
        }
        if (type != NDN_NAMETREE_PIT_TYPE) {
          uVar5 = uVar4;
        }
        uVar6 = uVar6 + uVar7;
      } while (uVar6 < len);
    }
    if (uVar5 != 0xffff) {
      return (nametree_entry_t *)(nametree + (ulong)uVar5 * 0x2e);
    }
  }
  return (nametree_entry_t *)0x0;
}

Assistant:

nametree_entry_t*
ndn_nametree_prefix_match(
                          ndn_nametree_t* nametree,
                          uint8_t name[],
                          size_t len,
                          enum NDN_NAMETREE_ENTRY_TYPE type)
{
  int now_node, last_node = NDN_INVALID_ID , father = 0 , tmp;
  size_t component_len, eqiv_component_len, offset = 0;
  if (len < 2) return NULL;
  if (name[1] < 253) offset = 2; else offset = 4;
  while (offset < len) {
    component_len = name[offset + 1] + 2;
    eqiv_component_len = minof2(component_len, NDN_NAME_COMPONENT_BUFFER_SIZE);
    now_node = (*nametree)[father].left_child;
    tmp = -2;
    while (now_node != NDN_INVALID_ID) {
      tmp = memcmp(name+offset,(*nametree)[now_node].val , eqiv_component_len);
      if (tmp <= 0) break;
      now_node = (*nametree)[now_node].right_bro;
    }
    if (tmp == 0) {
      if ((*nametree)[now_node].fib_id != NDN_INVALID_ID && type == NDN_NAMETREE_FIB_TYPE) last_node = now_node;
      if ((*nametree)[now_node].pit_id != NDN_INVALID_ID && type == NDN_NAMETREE_PIT_TYPE) last_node = now_node;
    } else break;
    offset += component_len;
    father = now_node;
  }
  if (last_node == NDN_INVALID_ID) return NULL; else return &(*nametree)[last_node];
}